

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  size_t sVar1;
  undefined1 *puVar2;
  int iVar3;
  undefined1 *puVar4;
  bool bVar5;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  while( true ) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,">","");
    puVar4 = local_70;
    sVar1 = (this->tokenizer_).current_.text._M_string_length;
    if ((sVar1 == local_68) &&
       ((sVar1 == 0 ||
        (iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_70,sVar1), iVar3 == 0)
        ))) {
      bVar5 = false;
    }
    else {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"}","");
      puVar2 = local_50;
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      if (sVar1 == local_48) {
        if (sVar1 == 0) {
          bVar5 = false;
        }
        else {
          iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar1);
          bVar5 = iVar3 != 0;
        }
      }
      else {
        bVar5 = true;
      }
      puVar4 = local_70;
      if (puVar2 != local_40) {
        operator_delete(puVar2);
        puVar4 = local_70;
      }
    }
    if (puVar4 != local_60) {
      operator_delete(puVar4);
    }
    if (!bVar5) break;
    bVar5 = ConsumeField(this,message);
    if (!bVar5) {
      return false;
    }
  }
  bVar5 = Consume(this,delimiter);
  return bVar5;
}

Assistant:

bool ConsumeMessage(Message* message, const std::string delimiter) {
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }